

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::LogAllocSegment(PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                  *this,uint segmentCount,size_t pageCount)

{
  unsigned_long *puVar1;
  size_t bytes;
  size_t pageCount_local;
  uint segmentCount_local;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_local;
  
  AddReservedBytes(this,pageCount << 0xc);
  AddCommittedBytes(this,pageCount << 0xc);
  AddNumberOfSegments(this,(ulong)segmentCount);
  if (this->memoryData != (PageMemoryData *)0x0) {
    this->memoryData->allocSegmentCount = (ulong)segmentCount + this->memoryData->allocSegmentCount;
    this->memoryData->allocSegmentBytes = pageCount * 0x1000 + this->memoryData->allocSegmentBytes;
    this->memoryData->currentCommittedPageCount =
         pageCount + this->memoryData->currentCommittedPageCount;
    puVar1 = max<unsigned_long>(&this->memoryData->peakCommittedPageCount,
                                &this->memoryData->currentCommittedPageCount);
    this->memoryData->peakCommittedPageCount = *puVar1;
  }
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::LogAllocSegment(uint segmentCount, size_t pageCount)
{
    size_t bytes = pageCount * AutoSystemInfo::PageSize;
    AddReservedBytes(bytes);
    AddCommittedBytes(bytes);
    AddNumberOfSegments(segmentCount);
#ifdef PROFILE_MEM
    if (this->memoryData)
    {
        this->memoryData->allocSegmentCount += segmentCount;
        this->memoryData->allocSegmentBytes += pageCount * AutoSystemInfo::PageSize;

        this->memoryData->currentCommittedPageCount += pageCount;
        this->memoryData->peakCommittedPageCount = max(this->memoryData->peakCommittedPageCount, this->memoryData->currentCommittedPageCount);
    }
#endif
}